

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O3

void vector_suite::test_int_one(void)

{
  vector<int,_std::allocator<int>_> value;
  oarchive ar;
  ostringstream result;
  vector<int,_std::allocator<int>_> local_228;
  int local_208;
  undefined4 uStack_204;
  long local_1f8 [2];
  undefined **local_1e8 [6];
  type local_1b8;
  pointer local_1a0;
  pointer local_190;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208 = 1;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_228,(iterator)0x0,&local_208);
  trial::protocol::serialization::
  save_overloader<trial::protocol::json::basic_oarchive<char>,_std::vector<int,_std::allocator<int>_>,_void>
  ::save((basic_oarchive<char> *)local_1e8,&local_228,0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"[1]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x1c3,"void vector_suite::test_int_one()",&local_208,"[1]");
  if ((long *)CONCAT44(uStack_204,local_208) != local_1f8) {
    operator_delete((long *)CONCAT44(uStack_204,local_208),local_1f8[0] + 1);
  }
  if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1e8[0] = &PTR_vsave_001248d0;
  if (local_1a0 != (pointer)0x0) {
    operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
  }
  (**(code **)local_1b8._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_int_one()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::vector<int> value;
    value.push_back(1);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1]");
}